

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::pumpTo(WebSocketPipeEnd *this,WebSocket *other)

{
  bool bVar1;
  WebSocketPipeImpl *pWVar2;
  undefined8 in_RDX;
  undefined1 local_88 [24];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
  deferredUnregister;
  Fault local_58;
  Fault f;
  undefined1 local_48 [8];
  DebugComparison<kj::Maybe<kj::WebSocket_&>_&,_const_kj::None_&> _kjCondition;
  WebSocket *other_local;
  WebSocketPipeEnd *this_local;
  
  _kjCondition._32_8_ = in_RDX;
  pWVar2 = Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::operator->
                     ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)(other + 1));
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           &pWVar2->destinationPumpingTo);
  kj::_::DebugExpression<kj::Maybe<kj::WebSocket&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::WebSocket_&>_&,_const_kj::None_&> *)local_48,
             (DebugExpression<kj::Maybe<kj::WebSocket&>&> *)&f,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::WebSocket&>&,kj::None_const&>&,char_const(&)[38]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1188,FAILED,"in->destinationPumpingTo == kj::none",
               "_kjCondition,\"can only call pumpTo() once at a time\"",
               (DebugComparison<kj::Maybe<kj::WebSocket_&>_&,_const_kj::None_&> *)local_48,
               (char (*) [38])"can only call pumpTo() once at a time");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  pWVar2 = Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::operator->
                     ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)(other + 1));
  Maybe<kj::WebSocket_&>::operator=(&pWVar2->destinationPumpingTo,(WebSocket *)_kjCondition._32_8_);
  local_88._8_8_ = other;
  defer<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>
            ((kj *)(local_88 + 0x10),(Type *)(local_88 + 8));
  pWVar2 = Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::operator->
                     ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)(other + 1));
  WebSocketPipeImpl::pumpTo((WebSocketPipeImpl *)local_88,&pWVar2->super_WebSocket);
  mv<kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
              *)(local_88 + 0x10));
  Promise<void>::
  attach<kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>
            ((Promise<void> *)this,
             (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
              *)local_88);
  Promise<void>::~Promise((Promise<void> *)local_88);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:4491:41)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
               *)(local_88 + 0x10));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    KJ_REQUIRE(in->destinationPumpingTo == kj::none, "can only call pumpTo() once at a time");
    // By convention, we store the WebSocket reference on `in`.
    in->destinationPumpingTo = other;
    auto deferredUnregister = kj::defer([this]() { in->destinationPumpingTo = kj::none; });
    return in->pumpTo(other).attach(kj::mv(deferredUnregister));
  }